

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  long in_RSI;
  int in_EDI;
  MyServer server;
  string fileSendName;
  string fileSendPath;
  LogStringBuffer buffer_1;
  LogStringBuffer buffer;
  LogStringBuffer buffer_2;
  LogStringBuffer buffer_4;
  LogStringBuffer buffer_3;
  LogStringBuffer buffer_5;
  LogStringBuffer buffer_6;
  char *in_stack_ffffffffffffeb18;
  LogStringBuffer *in_stack_ffffffffffffeb20;
  LogStringBuffer *in_stack_ffffffffffffeb58;
  Channel *buffer_00;
  OutputWorker *in_stack_ffffffffffffeb60;
  string *in_stack_ffffffffffffebb8;
  string *in_stack_ffffffffffffebc0;
  MyServer *in_stack_ffffffffffffebc8;
  allocator local_1279;
  string local_1278 [55];
  allocator local_1241;
  string local_1240 [32];
  long local_1220;
  int local_1218;
  int local_1214;
  string *local_1210;
  char *local_1208;
  Channel *local_1200;
  string *local_11f8;
  char *local_11f0;
  Channel *local_11e8;
  char *local_11e0;
  undefined2 *local_11d8;
  char *local_11d0;
  Channel *local_11c8;
  char *local_11c0;
  Channel *local_11b8;
  char *local_11b0;
  Channel *local_11a8;
  char *local_11a0;
  Channel *local_1198;
  char *local_1190;
  Channel *local_1188;
  string *local_1180;
  char *local_1178;
  undefined4 local_116c;
  Channel *local_1168;
  undefined4 local_115c;
  Channel *local_1158;
  string *local_1150;
  char *local_1148;
  undefined4 local_113c;
  Channel *local_1138;
  undefined4 local_112c;
  Channel *local_1128;
  undefined1 local_1110 [16];
  ostream aoStack_1100 [376];
  string *local_f88;
  char *local_f80;
  undefined4 local_f74;
  Channel *local_f70;
  undefined1 local_f58 [16];
  ostream aoStack_f48 [376];
  string *local_dd0;
  char *local_dc8;
  undefined4 local_dbc;
  Channel *local_db8;
  string *local_db0;
  char *local_da8;
  undefined8 local_da0;
  undefined1 *local_d98;
  Channel *local_d90;
  undefined8 local_d88;
  undefined1 *local_d80;
  Channel *local_d78;
  undefined8 local_d70;
  undefined1 *local_d68;
  string *local_d60;
  char *local_d58;
  undefined8 local_d50;
  undefined1 *local_d48;
  Channel *local_d40;
  undefined8 local_d38;
  undefined1 *local_d30;
  Channel *local_d28;
  undefined8 local_d20;
  undefined1 *local_d18;
  string *local_d10;
  char *local_d08;
  undefined1 *local_d00;
  Channel *local_cf8;
  string *local_cf0;
  undefined1 *local_ce8;
  Channel *local_ce0;
  string *local_cd8;
  undefined1 *local_cd0;
  string *local_cc8;
  char *local_cc0;
  undefined1 *local_cb8;
  Channel *local_cb0;
  string *local_ca8;
  undefined1 *local_ca0;
  Channel *local_c98;
  string *local_c90;
  undefined1 *local_c88;
  char *local_c80;
  undefined1 *local_c78;
  Channel *local_c70;
  char *local_c68;
  undefined1 *local_c60;
  Channel *local_c58;
  char *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  undefined1 *local_c38;
  char *local_c30;
  undefined2 *local_c28;
  char *local_c20;
  undefined4 local_c14;
  Channel *local_c10;
  undefined4 local_c04;
  Channel *local_c00;
  undefined1 local_be8 [16];
  ostream aoStack_bd8 [376];
  char *local_a60;
  ushort *local_a58;
  char *local_a50;
  undefined4 local_a44;
  Channel *local_a40;
  char *local_a38;
  ushort *local_a30;
  char *local_a28;
  undefined8 local_a20;
  undefined1 *local_a18;
  Channel *local_a10;
  undefined8 local_a08;
  undefined1 *local_a00;
  Channel *local_9f8;
  undefined8 local_9f0;
  undefined1 *local_9e8;
  char *local_9e0;
  ushort *local_9d8;
  char *local_9d0;
  undefined1 *local_9c8;
  Channel *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  Channel *local_9a8;
  char *local_9a0;
  ushort *local_998;
  undefined1 *local_990;
  Channel *local_988;
  char *local_980;
  undefined1 *local_978;
  ushort *local_970;
  undefined1 *local_968;
  Channel *local_960;
  ushort *local_958;
  undefined1 *local_950;
  char *local_948;
  undefined1 *local_940;
  Channel *local_938;
  char *local_930;
  undefined1 *local_928;
  char *local_920;
  undefined4 local_914;
  Channel *local_910;
  undefined4 local_904;
  Channel *local_900;
  char *local_8f8;
  undefined4 local_8ec;
  Channel *local_8e8;
  undefined4 local_8dc;
  Channel *local_8d8;
  undefined1 local_8c0 [16];
  ostream aoStack_8b0 [376];
  char *local_738;
  undefined4 local_72c;
  Channel *local_728;
  undefined1 local_710 [16];
  ostream aoStack_700 [376];
  char *local_588;
  undefined4 local_57c;
  Channel *local_578;
  char *local_570;
  undefined8 local_568;
  undefined1 *local_560;
  Channel *local_558;
  undefined8 local_550;
  undefined1 *local_548;
  Channel *local_540;
  undefined8 local_538;
  undefined1 *local_530;
  char *local_528;
  undefined8 local_520;
  undefined1 *local_518;
  Channel *local_510;
  undefined8 local_508;
  undefined1 *local_500;
  Channel *local_4f8;
  undefined8 local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  undefined1 *local_4d8;
  Channel *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  Channel *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  undefined1 *local_498;
  char *local_490;
  undefined4 local_484;
  Channel *local_480;
  undefined4 local_474;
  Channel *local_470;
  undefined1 local_458 [16];
  ostream aoStack_448 [376];
  char *local_2d0;
  undefined4 local_2c4;
  Channel *local_2c0;
  char *local_2b8;
  undefined8 local_2b0;
  undefined1 *local_2a8;
  Channel *local_2a0;
  undefined8 local_298;
  undefined1 *local_290;
  Channel *local_288;
  undefined8 local_280;
  undefined1 *local_278;
  char *local_270;
  undefined1 *local_268;
  Channel *local_260;
  char *local_258;
  undefined1 *local_250;
  char *local_248;
  undefined4 local_23c;
  Channel *local_238;
  undefined4 local_22c;
  Channel *local_228;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  undefined8 local_68;
  undefined1 *local_60;
  Channel *local_58;
  undefined8 local_50;
  undefined1 *local_48;
  Channel *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  pcVar1 = kFileSendPath;
  local_1214 = 0;
  local_1220 = in_RSI;
  local_1218 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1240,pcVar1,&local_1241);
  std::allocator<char>::~allocator((allocator<char> *)&local_1241);
  pcVar1 = kFileSendName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1278,pcVar1,&local_1279);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  if (1 < local_1218) {
    std::__cxx11::string::operator=(local_1240,*(char **)(local_1220 + 8));
    local_11e8 = &Logger;
    local_11f0 = "Using file send path: ";
    local_11f8 = local_1240;
    local_1168 = &Logger;
    local_116c = 2;
    local_1178 = "Using file send path: ";
    local_1158 = &Logger;
    local_115c = 2;
    local_1180 = local_11f8;
    if ((int)Logger.ChannelMinLevel < 3) {
      local_db8 = &Logger;
      local_dbc = 2;
      local_dc8 = "Using file send path: ";
      local_dd0 = local_11f8;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
      local_da0 = 0x116318;
      local_d90 = &Logger;
      local_d98 = local_f58;
      local_da8 = local_dc8;
      local_db0 = local_dd0;
      local_d78 = &Logger;
      local_d88 = local_da0;
      local_d80 = local_d98;
      local_d70 = local_da0;
      local_d68 = local_d98;
      std::operator<<(aoStack_f48,(string *)&Logger.Prefix);
      local_cb0 = &Logger;
      local_cb8 = local_d98;
      local_cc0 = local_da8;
      local_cc8 = local_db0;
      local_c70 = &Logger;
      local_c78 = local_d98;
      local_c80 = local_da8;
      local_c38 = local_d98;
      local_c40 = local_da8;
      std::operator<<((ostream *)(local_d98 + 0x10),local_da8);
      local_c98 = &Logger;
      local_ca0 = local_cb8;
      local_ca8 = local_cc8;
      local_c88 = local_cb8;
      local_c90 = local_cc8;
      std::operator<<((ostream *)(local_cb8 + 0x10),local_cc8);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x107d87);
    }
  }
  if (2 < local_1218) {
    std::__cxx11::string::operator=(local_1278,*(char **)(local_1220 + 0x10));
    local_1200 = &Logger;
    local_1208 = "Using file send name: ";
    local_1210 = local_1278;
    local_1138 = &Logger;
    local_113c = 2;
    local_1148 = "Using file send name: ";
    local_1128 = &Logger;
    local_112c = 2;
    local_1150 = local_1210;
    if ((int)Logger.ChannelMinLevel < 3) {
      local_f70 = &Logger;
      local_f74 = 2;
      local_f80 = "Using file send name: ";
      local_f88 = local_1210;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
      local_d50 = 0x116318;
      local_d40 = &Logger;
      local_d48 = local_1110;
      local_d58 = local_f80;
      local_d60 = local_f88;
      local_d28 = &Logger;
      local_d38 = local_d50;
      local_d30 = local_d48;
      local_d20 = local_d50;
      local_d18 = local_d48;
      std::operator<<(aoStack_1100,(string *)&Logger.Prefix);
      local_cf8 = &Logger;
      local_d00 = local_d48;
      local_d08 = local_d58;
      local_d10 = local_d60;
      local_c58 = &Logger;
      local_c60 = local_d48;
      local_c68 = local_d58;
      local_c48 = local_d48;
      local_c50 = local_d58;
      std::operator<<((ostream *)(local_d48 + 0x10),local_d58);
      local_ce0 = &Logger;
      local_ce8 = local_d00;
      local_cf0 = local_d10;
      local_cd0 = local_d00;
      local_cd8 = local_d10;
      std::operator<<((ostream *)(local_d00 + 0x10),local_d10);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x10820d);
    }
  }
  MyServer::MyServer((MyServer *)in_stack_ffffffffffffeb20);
  bVar2 = MyServer::Initialize
                    (in_stack_ffffffffffffebc8,in_stack_ffffffffffffebc0,in_stack_ffffffffffffebb8);
  if (bVar2) {
    local_11c8 = &Logger;
    local_11d0 = "File sending server started on port ";
    local_11d8 = &kFileSenderServerPort;
    local_11e0 = ".  Now start the file receiver client to receive a file";
    local_c10 = &Logger;
    local_c14 = 1;
    local_c20 = "File sending server started on port ";
    local_c28 = &kFileSenderServerPort;
    local_c30 = ".  Now start the file receiver client to receive a file";
    local_c00 = &Logger;
    local_c04 = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_a40 = &Logger;
      local_a44 = 1;
      local_a50 = "File sending server started on port ";
      local_a58 = &kFileSenderServerPort;
      local_a60 = ".  Now start the file receiver client to receive a file";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
      local_a20 = 0x116318;
      local_a10 = &Logger;
      local_a18 = local_be8;
      local_a28 = local_a50;
      local_a30 = local_a58;
      local_a38 = local_a60;
      local_9f8 = &Logger;
      local_a08 = local_a20;
      local_a00 = local_a18;
      local_9f0 = local_a20;
      local_9e8 = local_a18;
      std::operator<<(aoStack_bd8,(string *)&Logger.Prefix);
      local_9c0 = &Logger;
      local_9c8 = local_a18;
      local_9d0 = local_a28;
      local_9d8 = local_a30;
      local_9e0 = local_a38;
      local_9a8 = &Logger;
      local_9b0 = local_a18;
      local_9b8 = local_a28;
      local_978 = local_a18;
      local_980 = local_a28;
      std::operator<<((ostream *)(local_a18 + 0x10),local_a28);
      local_988 = &Logger;
      local_990 = local_9c8;
      local_998 = local_9d8;
      local_9a0 = local_9e0;
      local_960 = &Logger;
      local_968 = local_9c8;
      local_970 = local_9d8;
      local_950 = local_9c8;
      local_958 = local_9d8;
      std::ostream::operator<<((ostream *)(local_9c8 + 0x10),*local_9d8);
      local_938 = &Logger;
      local_940 = local_990;
      local_948 = local_9a0;
      local_928 = local_990;
      local_930 = local_9a0;
      std::operator<<((ostream *)(local_990 + 0x10),local_9a0);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1086d0);
    }
  }
  else {
    local_11a8 = &Logger;
    local_11b0 = "File sending server failed to start";
    local_910 = &Logger;
    local_914 = 1;
    local_920 = "File sending server failed to start";
    local_900 = &Logger;
    local_904 = 1;
    if ((int)Logger.ChannelMinLevel < 2) {
      local_578 = &Logger;
      local_57c = 1;
      local_588 = "File sending server failed to start";
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
      local_568 = 0x116318;
      local_558 = &Logger;
      local_560 = local_710;
      local_570 = local_588;
      local_540 = &Logger;
      local_550 = local_568;
      local_548 = local_560;
      local_538 = local_568;
      local_530 = local_560;
      std::operator<<(aoStack_700,(string *)&Logger.Prefix);
      local_4b8 = &Logger;
      local_4c0 = local_560;
      local_4c8 = local_570;
      local_4a8 = local_560;
      local_4b0 = local_570;
      std::operator<<((ostream *)(local_560 + 0x10),local_570);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1089c7);
    }
  }
  local_11b8 = &Logger;
  local_11c0 = "Press ENTER key to stop the server.";
  local_8e8 = &Logger;
  local_8ec = 1;
  local_8f8 = "Press ENTER key to stop the server.";
  local_8d8 = &Logger;
  local_8dc = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_728 = &Logger;
    local_72c = 1;
    local_738 = "Press ENTER key to stop the server.";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
    local_520 = 0x116318;
    local_510 = &Logger;
    local_518 = local_8c0;
    local_528 = local_738;
    local_4f8 = &Logger;
    local_508 = local_520;
    local_500 = local_518;
    local_4f0 = local_520;
    local_4e8 = local_518;
    std::operator<<(aoStack_8b0,(string *)&Logger.Prefix);
    local_4d0 = &Logger;
    local_4d8 = local_518;
    local_4e0 = local_528;
    local_498 = local_518;
    local_4a0 = local_528;
    std::operator<<((ostream *)(local_518 + 0x10),local_528);
    in_stack_ffffffffffffeb60 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffeb60,in_stack_ffffffffffffeb58);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108c2f);
  }
  getchar();
  MyServer::~MyServer((MyServer *)in_stack_ffffffffffffeb20);
  local_1198 = &Logger;
  local_11a0 = "Press ENTER key to terminate.";
  local_480 = &Logger;
  local_484 = 1;
  local_490 = "Press ENTER key to terminate.";
  buffer_00 = &Logger;
  local_470 = &Logger;
  local_474 = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_2c0 = &Logger;
    local_2c4 = 1;
    local_2d0 = "Press ENTER key to terminate.";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
    local_2b0 = 0x116318;
    local_2a0 = &Logger;
    local_2a8 = local_458;
    local_2b8 = local_2d0;
    local_288 = &Logger;
    local_298 = local_2b0;
    local_290 = local_2a8;
    local_280 = local_2b0;
    local_278 = local_2a8;
    std::operator<<(aoStack_448,(string *)&Logger.Prefix);
    local_260 = &Logger;
    local_268 = local_2a8;
    local_270 = local_2b8;
    local_250 = local_2a8;
    local_258 = local_2b8;
    std::operator<<((ostream *)(local_2a8 + 0x10),local_2b8);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffeb60,(LogStringBuffer *)buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x108ea9);
  }
  getchar();
  local_1188 = &Logger;
  local_1190 = "...Key press detected.  Terminating..";
  local_238 = &Logger;
  local_23c = 1;
  local_248 = "...Key press detected.  Terminating..";
  local_228 = &Logger;
  local_22c = 1;
  if ((int)Logger.ChannelMinLevel < 2) {
    local_78 = &Logger;
    local_7c = 1;
    local_88 = "...Key press detected.  Terminating..";
    logger::LogStringBuffer::LogStringBuffer
              (in_stack_ffffffffffffeb20,in_stack_ffffffffffffeb18,Trace);
    local_68 = 0x116318;
    local_58 = &Logger;
    local_60 = local_210;
    local_70 = local_88;
    local_40 = &Logger;
    local_50 = local_68;
    local_48 = local_60;
    local_38 = local_68;
    local_30 = local_60;
    std::operator<<(aoStack_200,(string *)&Logger.Prefix);
    local_18 = &Logger;
    local_20 = local_60;
    local_28 = local_70;
    local_8 = local_60;
    local_10 = local_70;
    std::operator<<((ostream *)(local_60 + 0x10),local_70);
    logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(in_stack_ffffffffffffeb60,(LogStringBuffer *)buffer_00);
    logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x109116);
  }
  local_1214 = 0;
  std::__cxx11::string::~string(local_1278);
  std::__cxx11::string::~string(local_1240);
  return local_1214;
}

Assistant:

int main(int argc, char** argv)
{
    std::string fileSendPath = kFileSendPath, fileSendName = kFileSendName;

    if (argc >= 2) {
        fileSendPath = argv[1];
        Logger.Info("Using file send path: ", fileSendPath);
    }
    if (argc >= 3) {
        fileSendName = argv[2];
        Logger.Info("Using file send name: ", fileSendName);
    }

    {
        MyServer server;

        if (server.Initialize(fileSendPath, fileSendName)) {
            Logger.Debug("File sending server started on port ", kFileSenderServerPort,
                ".  Now start the file receiver client to receive a file");
        }
        else {
            Logger.Debug("File sending server failed to start");
        }

        Logger.Debug("Press ENTER key to stop the server.");

        ::getchar();
    }

    Logger.Debug("Press ENTER key to terminate.");

    ::getchar();

    Logger.Debug("...Key press detected.  Terminating..");

    return 0;
}